

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O1

parser_error parse_entry_shortened_label(parser *p)

{
  _Bool _Var1;
  long *plVar2;
  char *pcVar3;
  size_t sVar4;
  parser_error pVar5;
  long lVar6;
  wchar_t wVar7;
  wchar_t n;
  
  plVar2 = (long *)parser_priv(p);
  if (plVar2 == (long *)0x0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    lVar6 = 0;
    do {
      pcVar3 = format("label%d",(ulong)((int)lVar6 + 1));
      _Var1 = parser_hasval(p,pcVar3);
      if (_Var1) {
        n = (wchar_t)(lVar6 + 1U);
        pcVar3 = format("label%d",lVar6 + 1U & 0xffffffff);
        pcVar3 = parser_getstr(p,pcVar3);
        sVar4 = text_mbstowcs(*(wchar_t **)(*plVar2 + 0x28 + lVar6 * 8),pcVar3,n);
        if (sVar4 == 0xffffffffffffffff) {
          return PARSE_ERROR_INVALID_VALUE;
        }
        wVar7 = (wchar_t)sVar4;
        if (wVar7 <= n) {
          n = wVar7;
        }
        sVar4 = text_mbstowcs((wchar_t *)((long)n * 4 + *(long *)(*plVar2 + 0x28 + lVar6 * 8)),"",
                              L'\x01');
        if (sVar4 == 0xffffffffffffffff) {
          return PARSE_ERROR_INVALID_VALUE;
        }
        *(wchar_t *)(*plVar2 + 0x17c + lVar6 * 4) = wVar7;
        return PARSE_ERROR_NONE;
      }
      lVar6 = lVar6 + 1;
    } while ((int)lVar6 != 10);
    pVar5 = PARSE_ERROR_INTERNAL;
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_entry_shortened_label(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	int n = 1;
	const char *name;
	size_t nw;

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	while (1) {
		if (n > MAX_SHORTENED) {
			return PARSE_ERROR_INTERNAL;
		}
		if (parser_hasval(p, format("label%d", n))) {
			break;
		}
		++n;
	}
	name = parser_getstr(p, format("label%d", n));
	nw = text_mbstowcs(embryo->entry->shortened_labels[n - 1], name, n);
	if (nw != (size_t) -1) {
		/* Ensure null termination. */
		size_t nw2 = text_mbstowcs(
			embryo->entry->shortened_labels[n - 1] +
			((int)nw < n ? (int)nw : n), "", 1);

		if (nw2 != (size_t)-1) {
			embryo->entry->nshortened[n - 1] = nw;
		} else {
			return PARSE_ERROR_INVALID_VALUE;
		}
	} else {
		return PARSE_ERROR_INVALID_VALUE;
	}
	return PARSE_ERROR_NONE;
}